

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceMesh::computeDefaultFaceTangentBasisX(SurfaceMesh *this)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  size_t sVar10;
  reference pvVar11;
  reference pvVar12;
  long in_RDI;
  vec<3,_float,_(glm::qualifier)0> *v2;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  vec<3,_float,_(glm::qualifier)0> vVar13;
  vec3 basisY;
  vec3 basisX;
  vec3 N;
  vec3 pB;
  vec3 pA;
  size_t start;
  size_t D;
  size_t iF;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe48;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffe50;
  vec<3,_float,_(glm::qualifier)0> *v1;
  size_type in_stack_fffffffffffffe68;
  vec<3,_float,_(glm::qualifier)0> *y;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffffe70;
  vec<3,_float,_(glm::qualifier)0> *x;
  string *in_stack_fffffffffffffeb0;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  vec<3,_float,_(glm::qualifier)0> local_98;
  vec<3,_float,_(glm::qualifier)0> local_88;
  undefined8 local_78;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_70;
  undefined8 local_68;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_60;
  ulong local_58;
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  ulong local_10;
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  nFaces((SurfaceMesh *)0x46a7ef);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_10 = 0;
  while( true ) {
    uVar9 = local_10;
    sVar10 = nFaces((SurfaceMesh *)0x46a81f);
    if (sVar10 <= uVar9) break;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x428),
                         local_10 + 1);
    vVar1 = *pvVar11;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x428),
                         local_10);
    local_18 = (ulong)(vVar1 - *pvVar11);
    if (local_18 != 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"Default face tangent spaces only available for pure-triangular meshes",
                 &local_39);
      exception(in_stack_fffffffffffffeb0);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x428),
                         local_10);
    local_58 = (ulong)*pvVar11;
    in_stack_fffffffffffffe50 =
         *(ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> **)(in_RDI + 0x490);
    v2 = (vec<3,_float,_(glm::qualifier)0> *)(in_RDI + 0x440);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)v2,local_58);
    pvVar12 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            *)in_stack_fffffffffffffe50,(ulong)*pvVar11);
    local_60 = pvVar12->field_2;
    local_68._0_4_ = pvVar12->field_0;
    local_68._4_4_ = pvVar12->field_1;
    v1 = *(vec<3,_float,_(glm::qualifier)0> **)(in_RDI + 0x490);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)v2,local_58 + 1);
    pvVar12 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            *)v1,(ulong)*pvVar11);
    local_70 = pvVar12->field_2;
    local_78._0_4_ = pvVar12->field_0;
    local_78._4_4_ = pvVar12->field_1;
    pvVar12 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[](*(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             **)(in_RDI + 0xcb8),local_10);
    local_88.field_2 = pvVar12->field_2;
    local_88.field_0 = pvVar12->field_0;
    local_88.field_1 = pvVar12->field_1;
    vVar13 = glm::operator-(v1,v2);
    local_98.field_2 = vVar13.field_2;
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = vVar13._0_8_;
    local_98._0_8_ = vmovlpd_avx(auVar2);
    x = &local_88;
    y = &local_98;
    glm::dot<3,float,(glm::qualifier)0>
              ((vec<3,_float,_(glm::qualifier)0> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48);
    vVar13 = glm::operator*(v1,(float)((ulong)v2 >> 0x20));
    auVar3._8_8_ = extraout_XMM0_Qb_00;
    auVar3._0_8_ = vVar13._0_8_;
    vmovlpd_avx(auVar3);
    vVar13 = glm::operator-(v1,v2);
    auVar4._8_8_ = extraout_XMM0_Qb_01;
    auVar4._0_8_ = vVar13._0_8_;
    vmovlpd_avx(auVar4);
    vVar13 = glm::normalize<3,float,(glm::qualifier)0>(v1);
    local_98.field_2 = vVar13.field_2;
    auVar5._8_8_ = extraout_XMM0_Qb_02;
    auVar5._0_8_ = vVar13._0_8_;
    local_98._0_8_ = vmovlpd_avx(auVar5);
    vVar13 = glm::cross<float,(glm::qualifier)0>(x,y);
    auVar6._8_8_ = extraout_XMM0_Qb_03;
    auVar6._0_8_ = vVar13._0_8_;
    vmovlpd_avx(auVar6);
    vVar13 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)in_stack_fffffffffffffe50);
    auVar7._8_8_ = extraout_XMM0_Qb_04;
    auVar7._0_8_ = vVar13._0_8_;
    in_stack_fffffffffffffeb0 = (string *)vmovlpd_avx(auVar7);
    vVar13 = glm::normalize<3,float,(glm::qualifier)0>(v1);
    auVar8._8_8_ = extraout_XMM0_Qb_05;
    auVar8._0_8_ = vVar13._0_8_;
    vmovlpd_avx(auVar8);
    pvVar12 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[](*(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             **)(in_RDI + 0x1140),local_10);
    pvVar12->field_0 = local_98.field_0;
    pvVar12->field_1 = local_98.field_1;
    pvVar12->field_2 = local_98.field_2;
    local_10 = local_10 + 1;
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (in_stack_fffffffffffffe50);
  return;
}

Assistant:

void SurfaceMesh::computeDefaultFaceTangentBasisX() {

  // NOTE: this function is weirdly duplicated into an 'X' and 'Y' paradigm to fit the compute-function-per-buffer
  // paradigm

  vertexPositions.ensureHostBufferPopulated();
  faceNormals.ensureHostBufferPopulated();

  defaultFaceTangentBasisX.data.resize(nFaces());

  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t D = faceIndsStart[iF + 1] - faceIndsStart[iF];
    if (D != 3) exception("Default face tangent spaces only available for pure-triangular meshes");

    size_t start = faceIndsStart[iF];

    glm::vec3 pA = vertexPositions.data[faceIndsEntries[start + 0]];
    glm::vec3 pB = vertexPositions.data[faceIndsEntries[start + 1]];
    glm::vec3 N = faceNormals.data[iF];

    glm::vec3 basisX = pB - pA;
    basisX = glm::normalize(basisX - N * glm::dot(N, basisX));

    glm::vec3 basisY = glm::normalize(-glm::cross(basisX, N));

    defaultFaceTangentBasisX.data[iF] = basisX;
  }

  defaultFaceTangentBasisX.markHostBufferUpdated();
}